

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

List<Kernel::Unit_*> *
Lib::List<Kernel::Unit_*>::concat(List<Kernel::Unit_*> *first,List<Kernel::Unit_*> *second)

{
  List<Kernel::Unit_*> *pLVar1;
  List<Kernel::Unit_*> *pLVar2;
  
  if (first == (List<Kernel::Unit_*> *)0x0) {
    return second;
  }
  pLVar1 = first;
  if (second != (List<Kernel::Unit_*> *)0x0) {
    do {
      pLVar2 = pLVar1;
      pLVar1 = pLVar2->_tail;
    } while (pLVar1 != (List<Kernel::Unit_*> *)0x0);
    pLVar2->_tail = second;
  }
  return first;
}

Assistant:

static List* concat(List* first,List* second)
  {
    if (first == 0) return second;
    if (second == 0) return first;

    List* current = first;
    for (;;) {
      List* next = current->tail();
      if (! next) {
        current->setTail(second);
        return first;
      }
      current = next;
    }
  }